

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O1

void Iso_FindNumbers(void)

{
  int iVar1;
  long lVar2;
  uchar *pNums;
  long lVar3;
  undefined1 *puVar4;
  uint Nums [1024];
  undefined1 local_1028 [4096];
  
  puVar4 = local_1028;
  srand(0x6f);
  lVar2 = 0;
  do {
    iVar1 = rand();
    local_1028[lVar2] = (char)iVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x1000);
  lVar2 = 0;
  do {
    printf("    ");
    lVar3 = 0;
    do {
      printf("0x%08x,",(ulong)*(uint *)(puVar4 + lVar3 * 4));
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    putchar(10);
    lVar2 = lVar2 + 1;
    puVar4 = puVar4 + 0x20;
  } while (lVar2 != 0x80);
  return;
}

Assistant:

void Iso_FindNumbers()
{
    unsigned Nums[1024];
    unsigned char * pNums = (unsigned char *)Nums;
    int i, j;
    srand( 111 );
    for ( i = 0; i < 1024 * 4; i++ )
        pNums[i] = (unsigned char)rand();
    // write out
    for ( i = 0; i < 128; i++ )
    {
        printf( "    " );
        for ( j = 0; j < 8; j++ )
            printf( "0x%08x,", Nums[i*8+j] );
        printf( "\n" );
    }
}